

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpg4d_parser.c
# Opt level: O3

MPP_RET mpp_mpg4_parser_flush(Mpg4dParser ctx)

{
  RK_S32 index;
  MppBufSlots slots;
  
  slots = *ctx;
  index = *(RK_S32 *)((long)ctx + 0x278);
  if (((byte)mpg4d_debug & 1) != 0) {
    _mpp_log_l(4,"mpg4d_parser","in\n","mpp_mpg4_parser_flush");
  }
  if (-1 < index && *(int *)((long)ctx + 0x27c) == 0) {
    mpp_buf_slot_set_flag(slots,index,SLOT_QUEUE_USE);
    mpp_buf_slot_enqueue(slots,index,QUEUE_DISPLAY);
    *(undefined4 *)((long)ctx + 0x27c) = 1;
  }
  if (((byte)mpg4d_debug & 1) != 0) {
    _mpp_log_l(4,"mpg4d_parser","out\n","mpp_mpg4_parser_flush");
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_mpg4_parser_flush(Mpg4dParser ctx)
{
    Mpg4dParserImpl *p = (Mpg4dParserImpl *)ctx;
    MppBufSlots slots = p->frame_slots;
    Mpg4Hdr *hdr_ref0 = &p->hdr_ref0;
    RK_S32 index = hdr_ref0->slot_idx;

    mpg4d_dbg_func("in\n");

    if (!hdr_ref0->enqueued && index >= 0) {
        mpp_buf_slot_set_flag(slots, index, SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(slots, index, QUEUE_DISPLAY);
        hdr_ref0->enqueued = 1;
    }

    mpg4d_dbg_func("out\n");

    return MPP_OK;
}